

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O3

Expression * slang::ast::IntegerLiteral::fromConstant(Compilation *compilation,SVInt *value)

{
  IntegerLiteral *pIVar1;
  SVInt val;
  bool local_21;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  undefined1 local_14;
  byte local_13;
  
  SVInt::resize((SVInt *)&local_20,(bitwidth_t)value);
  local_14 = 1;
  local_21 = true;
  pIVar1 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange_const&>
                     (&compilation->super_BumpAllocator,compilation,compilation->intType,
                      (SVInt *)&local_20,&local_21,(SourceRange *)&SourceRange::NoLocation);
  if (((0x40 < local_18) || ((local_13 & 1) != 0)) && ((void *)local_20.val != (void *)0x0)) {
    operator_delete__(local_20.pVal);
  }
  return &pIVar1->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromConstant(Compilation& compilation, const SVInt& value) {
    SVInt val = value.resize(32);
    val.setSigned(true);

    return *compilation.emplace<IntegerLiteral>(compilation, compilation.getIntType(),
                                                std::move(val), true, SourceRange::NoLocation);
}